

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_FundRawTransaction_PeginTx3_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_PeginTx3_Test *this)

{
  bool bVar1;
  int iVar2;
  int key;
  int iVar3;
  char *pcVar4;
  char *in_R9;
  char **in_stack_00000058;
  uint32_t *in_stack_00000060;
  int64_t *in_stack_00000068;
  double in_stack_00000070;
  char *in_stack_00000078;
  void *in_stack_00000080;
  void *in_stack_00000088;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  char *str_buffer;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  uint32_t append_count;
  char *output_tx_hex;
  int64_t tx_fee;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *fund_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  string txoutproof;
  string btc_tx;
  char *claim_script;
  undefined1 in_stack_00000935;
  undefined1 in_stack_00000936;
  undefined1 in_stack_00000937;
  char *in_stack_00000938;
  int64_t in_stack_00000940;
  uint32_t in_stack_0000094c;
  char *in_stack_00000950;
  void *in_stack_00000958;
  void *in_stack_00000960;
  char *in_stack_00000980;
  char *in_stack_000009a0;
  uint32_t in_stack_000009a8;
  uint32_t in_stack_000009b0;
  char *in_stack_000009b8;
  bool *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  void **in_stack_fffffffffffffba8;
  void **lhs_expression;
  void *in_stack_fffffffffffffbc8;
  char **in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  undefined8 in_stack_fffffffffffffc50;
  undefined1 bool_value;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffc5c;
  char *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 uVar6;
  int in_stack_fffffffffffffc6c;
  char *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 uVar7;
  allocator *reserved_address;
  allocator *asset;
  AssertHelper in_stack_fffffffffffffcf0;
  uint32_t in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  void *in_stack_fffffffffffffd08;
  AssertHelper local_2e8;
  Message local_2e0;
  AssertionResult local_2d8;
  AssertHelper local_2c8;
  Message local_2c0;
  undefined4 local_2b4;
  AssertionResult local_2b0;
  char *local_2a0;
  AssertHelper local_298;
  Message local_290;
  undefined4 local_284;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  AssertionResult local_260;
  AssertHelper local_250;
  Message local_248;
  undefined8 local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  undefined4 local_1fc;
  char *local_1f8;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined4 local_1d4;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined4 local_184;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  void *in_stack_ffffffffffffff18;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_b9;
  AssertionResult local_b8;
  AssertHelper local_a8;
  Message local_a0;
  undefined4 local_94;
  AssertionResult local_90;
  int local_7c;
  long local_78;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  void **local_10;
  
  bool_value = (undefined1)((ulong)in_stack_fffffffffffffc50 >> 0x38);
  local_10 = (void **)0x8019ec;
  asset = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc00000000"
             ,asset);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  reserved_address = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,
             "00000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f30105"
             ,reserved_address);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = 0;
  local_7c = CfdCreateHandle(in_stack_fffffffffffffba8);
  local_94 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dd9cb);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x81c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x3dda2e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dda83);
  local_b9 = local_78 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb88,(type *)0x3ddaaf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff10,(internal *)&local_b8,
               (AssertionResult *)"(NULL == handle)","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x81d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    testing::Message::~Message((Message *)0x3ddbad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ddc28);
  local_7c = CfdInitializeFundRawTx
                       (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                        in_stack_ffffffffffffff10,(char *)0x0,
                        (void **)in_stack_ffffffffffffff00.ptr_);
  local_10c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffef8);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3ddd18);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x822,pcVar4);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x3ddd7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dddd3);
  lhs_expression = local_10;
  if (local_7c == 0) {
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    in_stack_fffffffffffffba0 = 1;
    in_stack_fffffffffffffb98 = 0;
    in_stack_fffffffffffffb90 = 0;
    local_7c = CfdAddTxInputForFundRawTx
                         (in_stack_00000960,in_stack_00000958,in_stack_00000950,in_stack_0000094c,
                          in_stack_00000940,in_stack_00000938,in_stack_00000980,
                          (bool)in_stack_00000937,(bool)in_stack_00000936,(bool)in_stack_00000935,
                          in_stack_000009a0,in_stack_000009a8,in_stack_000009b0,in_stack_000009b8);
    local_134 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)lhs_expression,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    in_stack_fffffffffffffba8 = lhs_expression;
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3ddf70);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x82e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x3ddfd3);
      in_stack_fffffffffffffba8 = lhs_expression;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3de02b);
    iVar2 = CfdAddTargetAmountForFundRawTx
                      (in_stack_fffffffffffffd08,
                       (void *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcfc,(int64_t)in_stack_fffffffffffffcf0.data_,
                       (char *)asset,(char *)reserved_address);
    local_15c = 0;
    local_7c = iVar2;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc78);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      in_stack_fffffffffffffc70 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3de113);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x833,in_stack_fffffffffffffc70);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x3de176);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3de1ce);
    key = CfdSetOptionFundRawTx
                    ((void *)CONCAT44(iVar2,uVar7),in_stack_fffffffffffffc70,
                     in_stack_fffffffffffffc6c,(int64_t)in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     (bool)bool_value);
    local_184 = 0;
    local_7c = key;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc68);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      in_stack_fffffffffffffc60 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3de2b1);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x837,in_stack_fffffffffffffc60);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message((Message *)0x3de314);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3de36c);
    iVar3 = CfdSetOptionFundRawTx
                      ((void *)CONCAT44(iVar2,uVar7),in_stack_fffffffffffffc70,key,
                       (int64_t)in_stack_fffffffffffffc60,
                       (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (bool)bool_value);
    local_1ac = 0;
    local_7c = iVar3;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
    uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc58);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3de44d);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x83a,pcVar4);
      bool_value = (undefined1)((ulong)pcVar4 >> 0x38);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message((Message *)0x3de4b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3de508);
    local_7c = CfdSetOptionFundRawTx
                         ((void *)CONCAT44(iVar2,uVar7),in_stack_fffffffffffffc70,key,
                          (int64_t)in_stack_fffffffffffffc60,(double)CONCAT44(iVar3,uVar5),
                          (bool)bool_value);
    local_1d4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3de5eb);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x83d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      testing::Message::~Message((Message *)0x3de64e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3de6a6);
    local_1f8 = (char *)0x0;
    local_1fc = 0;
    local_7c = CfdFinalizeFundRawTx
                         (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070,
                          in_stack_00000068,in_stack_00000060,in_stack_00000058);
    local_214 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3de7b7);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x845,pcVar4);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x3de81a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3de86f);
    if (local_7c == 0) {
      local_240 = 0xc2;
      testing::internal::EqHelper<false>::Compare<long,long>
                ((char *)in_stack_fffffffffffffba8,
                 (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 (long *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (long *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      in_stack_fffffffffffffc2f = testing::AssertionResult::operator_cast_to_bool(&local_238);
      if (!(bool)in_stack_fffffffffffffc2f) {
        testing::Message::Message(&local_248);
        in_stack_fffffffffffffc20 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3de925);
        testing::internal::AssertHelper::AssertHelper
                  (&local_250,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x847,(char *)in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=(&local_250,&local_248);
        testing::internal::AssertHelper::~AssertHelper(&local_250);
        testing::Message::~Message((Message *)0x3de988);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3de9dd);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_260,"kExpTxData","output_tx_hex",
                 "020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000000000036cfe9a680d17595b0008a959219817af1ed2dcc33cc6cbf472728d2b022b5567016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000c200000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5de4a02fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f30105000000000000"
                 ,local_1f8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
      if (!bVar1) {
        testing::Message::Message(&local_268);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dea78);
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x848,pcVar4);
        testing::internal::AssertHelper::operator=(&local_270,&local_268);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        testing::Message::~Message((Message *)0x3deadb);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3deb30);
      CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    }
    local_7c = CfdFreeFundRawTxHandle((void *)CONCAT44(key,uVar6),in_stack_fffffffffffffc60);
    local_284 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
    if (!bVar1) {
      testing::Message::Message(&local_290);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dec14);
      testing::internal::AssertHelper::AssertHelper
                (&local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x84d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_298,&local_290);
      testing::internal::AssertHelper::~AssertHelper(&local_298);
      testing::Message::~Message((Message *)0x3dec71);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3decc6);
  }
  local_7c = CfdGetLastErrorCode(in_stack_fffffffffffffbc8);
  if (local_7c != 0) {
    local_2a0 = (char *)0x0;
    local_7c = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                          in_stack_fffffffffffffc20);
    local_2b4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
    if (!bVar1) {
      testing::Message::Message(&local_2c0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dedc7);
      testing::internal::AssertHelper::AssertHelper
                (&local_2c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x854,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
      testing::internal::AssertHelper::~AssertHelper(&local_2c8);
      testing::Message::~Message((Message *)0x3dee24);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dee79);
    testing::internal::CmpHelperSTREQ((internal *)&local_2d8,"\"\"","str_buffer","",local_2a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
    if (!bVar1) {
      testing::Message::Message(&local_2e0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3def0e);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x855,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
      testing::internal::AssertHelper::~AssertHelper(&local_2e8);
      testing::Message::~Message((Message *)0x3def6b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3defc0);
    CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    local_2a0 = (char *)0x0;
  }
  local_7c = CfdFreeHandle((void *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffd08);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffcf8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3df09c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffcf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x85b,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffcf0,(Message *)&stack0xfffffffffffffcf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffcf0);
    testing::Message::~Message((Message *)0x3df0f9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3df14e);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_PeginTx3) {
  // signed pegin tx
  const char* claim_script = "0014f3ea0aba73fdb23912ebd21f46e156cdd9e94280";
  std::string btc_tx = "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc00000000";
  std::string txoutproof = "00000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f30105";

  // 1 output data
  static const char* const kTxData = "020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000000000036cfe9a680d17595b0008a959219817af1ed2dcc33cc6cbf472728d2b022b5567016a0000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f301050000";
  static const char* const kExpTxData = "020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000000000036cfe9a680d17595b0008a959219817af1ed2dcc33cc6cbf472728d2b022b5567016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000c200000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5de4a02fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f30105000000000000";
  static const char* const kFeeAsset = "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fund_handle = nullptr;
  ret = CfdInitializeFundRawTx(
    handle, kCfdNetworkElementsRegtest, 1, kFeeAsset, &fund_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    ret = CfdAddTxInputForFundRawTx(
        handle, fund_handle,
        "5e5fd4e860d999b30b268ed583dfcfe805c395f8290d8307f6617fdc3f029de3", 0,
        99999500,
        "wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)",
        kFeeAsset,
        false, false, true, claim_script,
        btc_tx.length() / 2,
        txoutproof.length() / 2, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0,
        1, kFeeAsset,
        "el1qqtl9a3n6878ex25u0wv8u5qlzpfkycc0cftk65t52pkauk55jqka0fajk8d80lafn4t9kqxe77cu9ez2dyr6sq54lwy009uex");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
        0, 0, true);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxKnapsackMinChange, 0, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxBlindMinimumBits, 36, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t tx_fee;
    char* output_tx_hex = nullptr;
    uint32_t append_count = 0;
    ret = CfdFinalizeFundRawTx(
        handle, fund_handle, kTxData, 0.1, &tx_fee, &append_count,
        &output_tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(static_cast<int64_t>(194), tx_fee);
      EXPECT_STREQ(kExpTxData, output_tx_hex);
      CfdFreeStringBuffer(output_tx_hex);
    }

    ret = CfdFreeFundRawTxHandle(handle, fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}